

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.h
# Opt level: O3

void __thiscall QLineEditPrivate::~QLineEditPrivate(QLineEditPrivate *this)

{
  pointer pSVar1;
  Data *pDVar2;
  Data *pDVar3;
  
  *(undefined ***)&this->super_QWidgetPrivate = &PTR__QLineEditPrivate_007f45f8;
  pSVar1 = (this->trailingSideWidgets).
           super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->trailingSideWidgets).
                                 super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  pSVar1 = (this->leadingSideWidgets).
           super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->leadingSideWidgets).
                                 super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  pDVar2 = (this->placeholderText).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->placeholderText).d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((this->dndTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  if ((this->tripleClickTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  pDVar3 = (this->selectAllAction).wp.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if (*(int *)pDVar3 == 0) {
      pDVar3 = (this->selectAllAction).wp.d;
      if (pDVar3 == (Data *)0x0) {
        pDVar3 = (Data *)0x0;
      }
      operator_delete(pDVar3);
    }
  }
  QWidgetPrivate::~QWidgetPrivate(&this->super_QWidgetPrivate);
  return;
}

Assistant:

~QLineEditPrivate()
    {
    }